

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O0

int envy_bios_parse_dcb(envy_bios *bios)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  envy_bios_dcb *peVar16;
  envy_bios_dcb_entry *peVar17;
  int local_58;
  byte local_52 [2];
  int j_1;
  undefined2 local_4c;
  uint8_t bytes [10];
  envy_bios_dcb_entry *entry;
  int i;
  int j;
  uint8_t dev_rec [7];
  uint8_t defs;
  uint32_t sig;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_dcb *dcb;
  envy_bios *bios_local;
  
  peVar16 = &bios->dcb;
  if (peVar16->offset == 0) {
    return 0;
  }
  iVar3 = bios_u8(bios,(uint)peVar16->offset,&(bios->dcb).version);
  if (iVar3 == 0) {
    switch((bios->dcb).version) {
    case '\x10':
    case '\x11':
      (bios->dcb).hlen = '\0';
      (bios->dcb).rlen = '\0';
      (bios->dcb).version = '\0';
      bios->odcb_offset = (uint)peVar16->offset;
      peVar16->offset = 0;
      return 0;
    case '\x12':
      (bios->dcb).hlen = '\x04';
      sig = 4;
      (bios->dcb).entriesnum = '\x10';
      (bios->dcb).rlen = '\b';
      stack0xffffffffffffffd4 = 8;
      uVar4 = bios_u8(bios,peVar16->offset + 1,(uint8_t *)((long)&j + 3));
      uVar5 = bios_u16(bios,peVar16->offset + 2,&(bios->i2c).offset);
      wantrlen = uVar5 | uVar4;
      (bios->i2c).def[0] = j._3_1_ & 0xf;
      (bios->i2c).def[1] = (uint8_t)((int)(uint)j._3_1_ >> 4);
      bios->odcb_offset = peVar16->offset - 0x80;
      envy_bios_block(bios,bios->odcb_offset,0x80,"ODCB",-1);
      break;
    default:
      fprintf(_stderr,"Unknown DCB table version %d.%d\n",
              (ulong)(uint)((int)(uint)(bios->dcb).version >> 4),(ulong)((bios->dcb).version & 0xf))
      ;
      return -0x16;
    case '\x14':
    case '\x15':
      (bios->dcb).hlen = '\x04';
      sig = 4;
      (bios->dcb).entriesnum = '\x10';
      (bios->dcb).rlen = '\n';
      stack0xffffffffffffffd4 = 10;
      uVar4 = bios_u8(bios,peVar16->offset + 1,(uint8_t *)((long)&j + 3));
      uVar5 = bios_u16(bios,peVar16->offset + 2,&(bios->i2c).offset);
      wantrlen = uVar5 | uVar4;
      (bios->i2c).def[0] = j._3_1_ & 0xf;
      (bios->i2c).def[1] = (uint8_t)((int)(uint)j._3_1_ >> 4);
      break;
    case ' ':
    case '!':
    case '\"':
      (bios->dcb).hlen = '\b';
      sig = 8;
      (bios->dcb).entriesnum = '\x10';
      (bios->dcb).rlen = '\b';
      stack0xffffffffffffffd4 = 8;
      uVar4 = bios_u8(bios,peVar16->offset + 1,(uint8_t *)((long)&j + 3));
      uVar5 = bios_u16(bios,peVar16->offset + 2,&(bios->i2c).offset);
      uVar6 = bios_u32(bios,peVar16->offset + 4,(uint32_t *)dev_rec);
      wantrlen = uVar6 | uVar5 | uVar4;
      if (dev_rec._0_4_ != 0x4edcbdcb) {
        fprintf(_stderr,"DCB sig mismatch\n");
        return -0x16;
      }
      (bios->i2c).def[0] = j._3_1_ & 0xf;
      (bios->i2c).def[1] = (uint8_t)((int)(uint)j._3_1_ >> 4);
      break;
    case '0':
    case '@':
    case 'A':
      sig = 0x17;
      stack0xffffffffffffffd4 = 8;
      uVar4 = bios_u8(bios,peVar16->offset + 1,&(bios->dcb).hlen);
      uVar5 = bios_u8(bios,peVar16->offset + 2,&(bios->dcb).entriesnum);
      uVar6 = bios_u8(bios,peVar16->offset + 3,&(bios->dcb).rlen);
      uVar7 = bios_u16(bios,peVar16->offset + 4,&(bios->i2c).offset);
      uVar8 = bios_u32(bios,peVar16->offset + 6,(uint32_t *)dev_rec);
      uVar9 = bios_u16(bios,peVar16->offset + 10,&(bios->gpio).offset);
      uVar10 = bios_u16(bios,peVar16->offset + 0xc,&(bios->inputdev).offset);
      uVar11 = bios_u16(bios,peVar16->offset + 0xe,&(bios->cinema).offset);
      uVar12 = bios_u16(bios,peVar16->offset + 0x10,&(bios->spreadspectrum).offset);
      uVar13 = bios_u16(bios,peVar16->offset + 0x12,&(bios->extdev).offset);
      uVar14 = bios_u16(bios,peVar16->offset + 0x14,&(bios->conn).offset);
      uVar15 = bios_u8(bios,peVar16->offset + 0x16,&(bios->dcb).unk16);
      wantrlen = uVar15 | uVar14 | uVar13 | uVar12 | uVar11 | uVar10 | uVar9 | uVar8 | uVar7 | uVar6
                                                                                               | 
                                                  uVar5 | uVar4;
      if (0x18 < (bios->dcb).hlen) {
        sig = 0x19;
        uVar4 = bios_u16(bios,peVar16->offset + 0x17,&(bios->hdtvtt).offset);
        wantrlen = uVar4 | wantrlen;
      }
      if (0x1a < (bios->dcb).hlen) {
        sig = 0x1b;
        uVar4 = bios_u16(bios,peVar16->offset + 0x19,&(bios->mux).offset);
        wantrlen = uVar4 | wantrlen;
      }
      if (dev_rec._0_4_ != 0x4edcbdcb) {
        fprintf(_stderr,"DCB sig mismatch\n");
        return -0x16;
      }
    }
    envy_bios_block(bios,(uint)peVar16->offset,
                    (uint)(bios->dcb).hlen + (uint)(bios->dcb).rlen * (uint)(bios->dcb).entriesnum,
                    "DCB",-1);
    if ((0x13 < (bios->dcb).version) && ((bios->dcb).version < 0x30)) {
      for (entry._4_4_ = 0; entry._4_4_ < 7; entry._4_4_ = entry._4_4_ + 1) {
        uVar4 = bios_u8(bios,(peVar16->offset - 7) + entry._4_4_,
                        (uint8_t *)((long)&i + (long)entry._4_4_));
        wantrlen = uVar4 | wantrlen;
      }
      if ((wantrlen == 0) && (iVar3 = memcmp(&i,"DEV_REC",7), iVar3 == 0)) {
        bios->dev_rec_offset = peVar16->offset - 7;
        bios->odcb_offset = bios->dev_rec_offset - 0x80;
        envy_bios_block(bios,bios->dev_rec_offset,7,"DEV_REC",-1);
        envy_bios_block(bios,bios->odcb_offset,0x80,"ODCB",-1);
      }
      else {
        iVar3 = envy_bios_parse_rdcb(bios);
        if (iVar3 != 0) {
          fprintf(_stderr,"Failed to parse RDCB table at 0x%04x version %d.%d\n",
                  (ulong)(bios->dcb).offset,(ulong)(uint)((int)(uint)(bios->dcb).rdcb_version >> 4),
                  (ulong)((bios->dcb).rdcb_version & 0xf));
        }
      }
    }
    if (wantrlen == 0) {
      if ((bios->dcb).hlen < sig) {
        fprintf(_stderr,"DCB table header too short [%d < %d]\n",(ulong)(bios->dcb).hlen,(ulong)sig)
        ;
        bios_local._4_4_ = -0x16;
      }
      else if ((int)(uint)(bios->dcb).rlen < (int)stack0xffffffffffffffd4) {
        fprintf(_stderr,"DCB table record too short [%d < %d]\n",(ulong)(bios->dcb).rlen,
                (ulong)stack0xffffffffffffffd4);
        bios_local._4_4_ = -0x16;
      }
      else {
        if (sig < (bios->dcb).hlen) {
          fprintf(_stderr,"DCB table header longer than expected [%d > %d]\n",
                  (ulong)(bios->dcb).hlen,(ulong)sig);
        }
        if ((int)stack0xffffffffffffffd4 < (int)(uint)(bios->dcb).rlen) {
          fprintf(_stderr,"DCB table record longer than expected [%d > %d]\n",
                  (ulong)(bios->dcb).rlen,(ulong)stack0xffffffffffffffd4);
        }
        peVar17 = (envy_bios_dcb_entry *)calloc((ulong)(bios->dcb).entriesnum,0x20);
        (bios->dcb).entries = peVar17;
        if ((bios->dcb).entries == (envy_bios_dcb_entry *)0x0) {
          bios_local._4_4_ = -0xc;
        }
        else {
          for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->dcb).entriesnum;
              entry._0_4_ = (int)entry + 1) {
            bytes._2_8_ = (bios->dcb).entries + (int)entry;
            ((envy_bios_dcb_entry *)bytes._2_8_)->offset =
                 peVar16->offset + (ushort)(bios->dcb).hlen +
                 (ushort)(bios->dcb).rlen * (short)(int)entry;
            local_58 = 0;
            while( true ) {
              bVar1 = false;
              if (local_58 < 10) {
                bVar1 = local_58 < (int)(uint)(bios->dcb).rlen;
              }
              if (!bVar1) break;
              iVar3 = bios_u8(bios,(uint)*(ushort *)bytes._2_8_ + local_58,local_52 + local_58);
              if (iVar3 != 0 || wantrlen != 0) {
                return -0xe;
              }
              local_58 = local_58 + 1;
              wantrlen = 0;
            }
            if ((bios->dcb).version < 0x20) {
              if (0x13 < (bios->dcb).version) {
                *(byte *)(bytes._2_8_ + 2) = local_52[0] & 0xf;
                *(char *)(bytes._2_8_ + 6) = (char)((int)(uint)local_52[0] >> 4);
                *(byte *)(bytes._2_8_ + 3) =
                     (byte)((int)(uint)local_52[1] >> 6) | ((byte)j_1 & 3) << 2;
                uVar2 = (undefined1)(1 << ((byte)((int)(uint)(byte)j_1 >> 2) & 7));
                *(undefined1 *)(bytes._2_8_ + 0xb) = uVar2;
                *(undefined1 *)(bytes._2_8_ + 4) = uVar2;
                *(char *)(bytes._2_8_ + 9) = (char)((int)(uint)(byte)j_1 >> 5);
                *(byte *)(bytes._2_8_ + 8) = (byte)((int)(uint)j_1._1_1_ >> 1) & 7;
                if (*(char *)(bytes._2_8_ + 2) == '\0') {
                  *(uint *)(bytes._2_8_ + 0x14) = (uint)local_4c * 10;
                }
              }
            }
            else {
              *(byte *)(bytes._2_8_ + 2) = local_52[0] & 0xf;
              *(char *)(bytes._2_8_ + 3) = (char)((int)(uint)local_52[0] >> 4);
              *(byte *)(bytes._2_8_ + 4) = local_52[1] & 0xf;
              if ((bios->dcb).version < 0x30) {
                *(char *)(bytes._2_8_ + 7) = (char)((int)(uint)local_52[1] >> 4);
              }
              else {
                *(char *)(bytes._2_8_ + 5) = (char)((int)(uint)local_52[1] >> 4);
              }
              *(byte *)(bytes._2_8_ + 8) = (byte)j_1 & 0xf;
              *(byte *)(bytes._2_8_ + 9) = (byte)j_1 >> 4 & 3;
              *(byte *)(bytes._2_8_ + 10) = (byte)j_1 >> 6;
              *(byte *)(bytes._2_8_ + 0xb) = j_1._1_1_ & 0xf;
              *(byte *)(bytes._2_8_ + 0xc) = j_1._1_1_ >> 4;
              *(byte *)(bytes._2_8_ + 0xd) = j_1._2_1_;
              *(undefined1 *)(bytes._2_8_ + 0xe) = j_1._3_1_;
              *(byte *)(bytes._2_8_ + 0xf) = (byte)local_4c;
              *(byte *)(bytes._2_8_ + 0x10) = local_4c._1_1_;
              switch(*(undefined1 *)(bytes._2_8_ + 2)) {
              case 0:
                if ((bios->dcb).version < 0x30) {
                  *(uint *)(bytes._2_8_ + 0x14) = (uint)j_1._2_2_ * 10;
                  *(undefined1 *)(bytes._2_8_ + 0xd) = 0;
                  *(undefined1 *)(bytes._2_8_ + 0xe) = 0;
                }
                else {
                  *(uint *)(bytes._2_8_ + 0x14) = (uint)j_1._2_1_ * 10000;
                  *(undefined1 *)(bytes._2_8_ + 0xd) = 0;
                }
                break;
              default:
                break;
              case 2:
                if ((bios->dcb).version < 0x30) {
                  *(char *)(bytes._2_8_ + 0x1e) = (char)((int)(uint)j_1._2_1_ >> 4);
                  *(byte *)(bytes._2_8_ + 0xd) = *(byte *)(bytes._2_8_ + 0xd) & 0xf;
                }
                else {
                  *(undefined1 *)(bytes._2_8_ + 0x1e) = j_1._3_1_;
                  *(undefined1 *)(bytes._2_8_ + 0xe) = 0;
                  *(bool *)(bytes._2_8_ + 0x1a) = (local_4c & 2) != 0;
                  *(byte *)(bytes._2_8_ + 0xf) = *(byte *)(bytes._2_8_ + 0xf) & 0xfd;
                }
                break;
              case 3:
                *(byte *)(bytes._2_8_ + 0x18) = j_1._2_1_ & 3;
                *(byte *)(bytes._2_8_ + 0x19) = (byte)((int)(uint)j_1._2_1_ >> 2) & 3;
                *(byte *)(bytes._2_8_ + 0xd) = *(byte *)(bytes._2_8_ + 0xd) & 0xf0;
                break;
              case 6:
                *(undefined1 *)(bytes._2_8_ + 0x1e) = j_1._3_1_;
                *(undefined1 *)(bytes._2_8_ + 0xe) = 0;
                *(char *)(bytes._2_8_ + 0x1b) = (char)((int)(uint)(byte)local_4c >> 5);
                *(byte *)(bytes._2_8_ + 0xf) = *(byte *)(bytes._2_8_ + 0xf) & 0x1f;
                *(byte *)(bytes._2_8_ + 0x1c) = local_4c._1_1_ & 0xf;
                *(byte *)(bytes._2_8_ + 0x10) = *(byte *)(bytes._2_8_ + 0x10) & 0xf0;
              }
              if ((((*(char *)(bytes._2_8_ + 2) == '\x03') || (*(char *)(bytes._2_8_ + 2) == '\x02')
                   ) || (*(char *)(bytes._2_8_ + 2) == '\x06')) && (0x3f < (bios->dcb).version)) {
                *(byte *)(bytes._2_8_ + 0xd) = *(byte *)(bytes._2_8_ + 0xd) & 0xcf;
                *(byte *)(bytes._2_8_ + 0x1d) = (byte)((int)(uint)j_1._2_1_ >> 4) & 3;
                *(byte *)(bytes._2_8_ + 0xf) = *(byte *)(bytes._2_8_ + 0xf) & 0xfd;
              }
            }
          }
          (bios->dcb).valid = '\x01';
          iVar3 = envy_bios_parse_i2c(bios);
          if (iVar3 != 0) {
            fprintf(_stderr,"Failed to parse I2C table at 0x%04x version %d.%d\n",
                    (ulong)(bios->i2c).offset,(ulong)(uint)((int)(uint)(bios->i2c).version >> 4),
                    (ulong)((bios->i2c).version & 0xf));
          }
          iVar3 = envy_bios_parse_gpio(bios);
          if (iVar3 != 0) {
            fprintf(_stderr,"Failed to parse GPIO table at 0x%04x version %d.%d\n",
                    (ulong)(bios->gpio).offset,(ulong)(uint)((int)(uint)(bios->gpio).version >> 4),
                    (ulong)((bios->gpio).version & 0xf));
          }
          iVar3 = envy_bios_parse_inputdev(bios);
          if (iVar3 != 0) {
            fprintf(_stderr,"Failed to parse INPUTDEV table at 0x%04x version %d.%d\n",
                    (ulong)(bios->inputdev).offset,
                    (ulong)(uint)((int)(uint)(bios->inputdev).version >> 4),
                    (ulong)((bios->inputdev).version & 0xf));
          }
          iVar3 = envy_bios_parse_cinema(bios);
          if (iVar3 != 0) {
            fprintf(_stderr,"Failed to parse CINEMA table at 0x%04x version %d.%d\n",
                    (ulong)(bios->cinema).offset,
                    (ulong)(uint)((int)(uint)(bios->cinema).version >> 4),
                    (ulong)((bios->cinema).version & 0xf));
          }
          iVar3 = envy_bios_parse_spreadspectrum(bios);
          if (iVar3 != 0) {
            fprintf(_stderr,"Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n",
                    (ulong)(bios->spreadspectrum).offset,
                    (ulong)(uint)((int)(uint)(bios->spreadspectrum).version >> 4),
                    (ulong)((bios->spreadspectrum).version & 0xf));
          }
          iVar3 = envy_bios_parse_extdev(bios);
          if (iVar3 != 0) {
            fprintf(_stderr,"Failed to parse EXTDEV table at 0x%04x version %d.%d\n",
                    (ulong)(bios->extdev).offset,
                    (ulong)(uint)((int)(uint)(bios->extdev).version >> 4),
                    (ulong)((bios->extdev).version & 0xf));
          }
          iVar3 = envy_bios_parse_conn(bios);
          if (iVar3 != 0) {
            fprintf(_stderr,"Failed to parse CONN table at 0x%04x version %d.%d\n",
                    (ulong)(bios->conn).offset,(ulong)(uint)((int)(uint)(bios->conn).version >> 4),
                    (ulong)((bios->conn).version & 0xf));
          }
          iVar3 = envy_bios_parse_hdtvtt(bios);
          if (iVar3 != 0) {
            fprintf(_stderr,"Failed to parse HDTVTT table at 0x%04x version %d.%d\n",
                    (ulong)(bios->hdtvtt).offset,
                    (ulong)(uint)((int)(uint)(bios->hdtvtt).version >> 4),
                    (ulong)((bios->hdtvtt).version & 0xf));
          }
          iVar3 = envy_bios_parse_mux(bios);
          if (iVar3 != 0) {
            fprintf(_stderr,"Failed to parse MUX table at 0x%04x version %d.%d\n",
                    (ulong)(bios->mux).offset,(ulong)(uint)((int)(uint)(bios->mux).version >> 4),
                    (ulong)((bios->mux).version & 0xf));
          }
          bios_local._4_4_ = 0;
        }
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
    return bios_local._4_4_;
  }
  return -0xe;
}

Assistant:

int envy_bios_parse_dcb (struct envy_bios *bios) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	if (!dcb->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, dcb->offset, &dcb->version);
	if (err)
		return -EFAULT;
	int wanthlen, wantrlen;
	uint32_t sig;
	uint8_t defs;
	switch (dcb->version) {
		case 0x10:
		case 0x11:
			/* old useless crap */
			wanthlen = dcb->hlen = 0;
			wantrlen = dcb->rlen = 0;
			dcb->version = 0;
			bios->odcb_offset = dcb->offset;
			dcb->offset = 0;
			return 0;
		case 0x12:
			wanthlen = dcb->hlen = 4;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			bios->odcb_offset = dcb->offset - 0x80;
			envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
			break;
		case 0x14:
		case 0x15:
			wanthlen = dcb->hlen = 4;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 10;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			break;
		case 0x22:
		case 0x20:
		case 0x21:
			wanthlen = dcb->hlen = 8;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			err |= bios_u32(bios, dcb->offset+4, &sig);
			if (sig != 0x4edcbdcb) {
				ENVY_BIOS_ERR("DCB sig mismatch\n");
				return -EINVAL;
			}
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			break;
		case 0x30:
		case 0x40:
		case 0x41:
			wanthlen = 23;
			wantrlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &dcb->hlen);
			err |= bios_u8(bios, dcb->offset+2, &dcb->entriesnum);
			err |= bios_u8(bios, dcb->offset+3, &dcb->rlen);
			err |= bios_u16(bios, dcb->offset+4, &bios->i2c.offset);
			err |= bios_u32(bios, dcb->offset+6, &sig);
			err |= bios_u16(bios, dcb->offset+10, &bios->gpio.offset);
			err |= bios_u16(bios, dcb->offset+12, &bios->inputdev.offset);
			err |= bios_u16(bios, dcb->offset+14, &bios->cinema.offset);
			err |= bios_u16(bios, dcb->offset+16, &bios->spreadspectrum.offset);
			err |= bios_u16(bios, dcb->offset+18, &bios->extdev.offset);
			err |= bios_u16(bios, dcb->offset+20, &bios->conn.offset);
			err |= bios_u8(bios, dcb->offset+22, &dcb->unk16);
			if (dcb->hlen >= 25) {
				wanthlen = 25;
				err |= bios_u16(bios, dcb->offset+23, &bios->hdtvtt.offset);
			}
			if (dcb->hlen >= 27) {
				wanthlen = 27;
				err |= bios_u16(bios, dcb->offset+25, &bios->mux.offset);
			}
			if (sig != 0x4edcbdcb) {
				ENVY_BIOS_ERR("DCB sig mismatch\n");
				return -EINVAL;
			}
			break;
		default:
			ENVY_BIOS_ERR("Unknown DCB table version %d.%d\n", dcb->version >> 4, dcb->version & 0xf);
			return -EINVAL;
	}
	envy_bios_block(bios, dcb->offset, dcb->hlen + dcb->rlen * dcb->entriesnum, "DCB", -1);
	if (dcb->version >= 0x14 && dcb->version < 0x30) {
		uint8_t dev_rec[7];
		int j;
		for (j = 0; j < 7; j++)
			err |= bios_u8(bios, dcb->offset-7+j, &dev_rec[j]);
		if (!err && !memcmp(dev_rec, "DEV_REC", 7)) {
			bios->dev_rec_offset = dcb->offset - 7;
			bios->odcb_offset = bios->dev_rec_offset - 0x80;
			envy_bios_block(bios, bios->dev_rec_offset, 7, "DEV_REC", -1);
			envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
		} else {
			if (envy_bios_parse_rdcb(bios))
				ENVY_BIOS_ERR("Failed to parse RDCB table at 0x%04x version %d.%d\n", bios->dcb.offset, bios->dcb.rdcb_version >> 4, bios->dcb.rdcb_version & 0xf);
		}
	}
	if (err)
		return -EFAULT;
	if (dcb->hlen < wanthlen) {
		ENVY_BIOS_ERR("DCB table header too short [%d < %d]\n", dcb->hlen, wanthlen);
		return -EINVAL;
	}
	if (dcb->rlen < wantrlen) {
		ENVY_BIOS_ERR("DCB table record too short [%d < %d]\n", dcb->rlen, wantrlen);
		return -EINVAL;
	}
	if (dcb->hlen > wanthlen) {
		ENVY_BIOS_WARN("DCB table header longer than expected [%d > %d]\n", dcb->hlen, wanthlen);
	}
	if (dcb->rlen > wantrlen) {
		ENVY_BIOS_WARN("DCB table record longer than expected [%d > %d]\n", dcb->rlen, wantrlen);
	}
	dcb->entries = calloc(dcb->entriesnum, sizeof *dcb->entries);
	if (!dcb->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < dcb->entriesnum; i++) {
		struct envy_bios_dcb_entry *entry = &dcb->entries[i];
		entry->offset = dcb->offset + dcb->hlen + dcb->rlen * i;
		uint8_t bytes[10];
		int j;
		for (j = 0; j < 10 && j < dcb->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		if (dcb->version >= 0x20) {
			entry->type = bytes[0] & 0xf;
			entry->i2c = bytes[0] >> 4;
			entry->heads = bytes[1] & 0xf;
			if (dcb->version >= 0x30)
				entry->conn = bytes[1] >> 4;
			else
				entry->unk01_4 = bytes[1] >> 4;
			entry->conntag = bytes[2] & 0xf;
			entry->loc = bytes[2] >> 4 & 3;
			entry->unk02_6 = bytes[2] >> 6;
			entry->or = bytes[3] & 0xf;
			entry->unk03_4 = bytes[3] >> 4; /* seen used once on quadro, not sure if it means something */
			entry->unk04 = bytes[4];
			entry->unk05 = bytes[5];
			entry->unk06 = bytes[6];
			entry->unk07 = bytes[7];
			switch (entry->type) {
				case ENVY_BIOS_DCB_ANALOG:
					if (dcb->version < 0x30) {
						entry->maxfreq = (bytes[4] | bytes[5] << 8) * 10;
						entry->unk04 = 0;
						entry->unk05 = 0;
					} else {
						entry->maxfreq = bytes[4] * 10000;
						entry->unk04 = 0;
					}
					break;
				case ENVY_BIOS_DCB_TMDS:
					if (dcb->version < 0x30) {
						entry->ext_addr = bytes[4] >> 4;
						entry->unk04 &= ~0xf0;
					} else {
						entry->ext_addr = bytes[5];
						entry->unk05 = 0;
						entry->tmds_hdmi = !!(bytes[6] & 2);
						entry->unk06 &= ~2;
					}
					break;
				case ENVY_BIOS_DCB_LVDS:
					entry->lvds_info = bytes[4] & 3;
					entry->lvds_pscript = bytes[4] >> 2 & 3;
					entry->unk04 &= ~0xf;
					break;
				case ENVY_BIOS_DCB_DP:
					entry->ext_addr = bytes[5];
					entry->unk05 = 0;
					entry->dp_bw = bytes[6] >> 5;
					entry->unk06 &= ~0xe0;
					entry->dp_lanes = bytes[7] & 0xf;
					entry->unk07 &= ~0xf;
					break;
				/* XXX: TV */
				default:
					break;
			}
			if ((entry->type == ENVY_BIOS_DCB_LVDS || entry->type == ENVY_BIOS_DCB_TMDS || entry->type == ENVY_BIOS_DCB_DP) && dcb->version >= 0x40) {
				entry->unk04 &= ~0x30;
				entry->links = bytes[4] >> 4 & 3;
				entry->unk06 &= ~2;
			}
		} else if (dcb->version >= 0x14) {
			entry->type = bytes[0] & 0xf;
			entry->unk00_4 = bytes[0] >> 4;
			entry->i2c = (bytes[1] >> 6 & 3) | (bytes[2] << 2 & 0xc);
			entry->heads = entry->or = 1 << (bytes[2] >> 2 & 7);
			entry->loc = (bytes[2] >> 5) | (bytes[3] << 3 & 1);
			entry->conntag = bytes[3] >> 1 & 7;
			if (entry->type == ENVY_BIOS_DCB_ANALOG)
				entry->maxfreq = (bytes[6] | bytes[7] << 8) * 10;
			/* XXX */
		} else {
			/* XXX */
		}
	}
	dcb->valid = 1;
	if (envy_bios_parse_i2c(bios))
		ENVY_BIOS_ERR("Failed to parse I2C table at 0x%04x version %d.%d\n", bios->i2c.offset, bios->i2c.version >> 4, bios->i2c.version & 0xf);
	if (envy_bios_parse_gpio(bios))
		ENVY_BIOS_ERR("Failed to parse GPIO table at 0x%04x version %d.%d\n", bios->gpio.offset, bios->gpio.version >> 4, bios->gpio.version & 0xf);
	if (envy_bios_parse_inputdev(bios))
		ENVY_BIOS_ERR("Failed to parse INPUTDEV table at 0x%04x version %d.%d\n", bios->inputdev.offset, bios->inputdev.version >> 4, bios->inputdev.version & 0xf);
	if (envy_bios_parse_cinema(bios))
		ENVY_BIOS_ERR("Failed to parse CINEMA table at 0x%04x version %d.%d\n", bios->cinema.offset, bios->cinema.version >> 4, bios->cinema.version & 0xf);
	if (envy_bios_parse_spreadspectrum(bios))
		ENVY_BIOS_ERR("Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n", bios->spreadspectrum.offset, bios->spreadspectrum.version >> 4, bios->spreadspectrum.version & 0xf);
	if (envy_bios_parse_extdev(bios))
		ENVY_BIOS_ERR("Failed to parse EXTDEV table at 0x%04x version %d.%d\n", bios->extdev.offset, bios->extdev.version >> 4, bios->extdev.version & 0xf);
	if (envy_bios_parse_conn(bios))
		ENVY_BIOS_ERR("Failed to parse CONN table at 0x%04x version %d.%d\n", bios->conn.offset, bios->conn.version >> 4, bios->conn.version & 0xf);
	if (envy_bios_parse_hdtvtt(bios))
		ENVY_BIOS_ERR("Failed to parse HDTVTT table at 0x%04x version %d.%d\n", bios->hdtvtt.offset, bios->hdtvtt.version >> 4, bios->hdtvtt.version & 0xf);
	if (envy_bios_parse_mux(bios))
		ENVY_BIOS_ERR("Failed to parse MUX table at 0x%04x version %d.%d\n", bios->mux.offset, bios->mux.version >> 4, bios->mux.version & 0xf);
	return 0;
}